

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall mathOps_divides_Test::~mathOps_divides_Test(mathOps_divides_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(mathOps, divides)
{
    precise_measurement m1(0.0001, precise::m * precise::N);

    precise_measurement m2(5.4, precise::in);
    precise_measurement m3(0.01, precise::km);

    auto m4 = divides(m1, m2);
    auto m5 = m1 / m2;
    EXPECT_EQ(m4, m5);

    EXPECT_EQ(divides(m2, m3).units(), precise::km * precise::pu);
    EXPECT_EQ(divides(m3, m2).units(), precise::in * precise::pu);

    measurement change = 0.0001 * m;
    measurement length = 10.0 * m;

    auto res = divides(change, length);

    EXPECT_EQ(to_string(res), "1e-05 strain");
}